

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDie::attribute_iterator::attribute_iterator(attribute_iterator *this,DWARFDie D,bool End)

{
  byte bVar1;
  DWARFAbbreviationDeclaration *this_00;
  size_t sVar2;
  uint64_t uVar3;
  DWARFAbbreviationDeclaration *AbbrDecl;
  bool End_local;
  attribute_iterator *this_local;
  DWARFDie D_local;
  
  D_local.U = (DWARFUnit *)D.Die;
  this_local = (attribute_iterator *)D.U;
  (this->Die).U = (DWARFUnit *)this_local;
  (this->Die).Die = (DWARFDebugInfoEntry *)D_local.U;
  DWARFAttribute::DWARFAttribute(&this->AttrValue);
  this->Index = 0;
  this_00 = getAbbreviationDeclarationPtr(&this->Die);
  if (this_00 == (DWARFAbbreviationDeclaration *)0x0) {
    __assert_fail("AbbrDecl && \"Must have abbreviation declaration\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDie.cpp"
                  ,0x2a2,"llvm::DWARFDie::attribute_iterator::attribute_iterator(DWARFDie, bool)");
  }
  if (End) {
    sVar2 = DWARFAbbreviationDeclaration::getNumAttributes(this_00);
    this->Index = (uint32_t)sVar2;
  }
  else {
    uVar3 = getOffset((DWARFDie *)&this_local);
    bVar1 = DWARFAbbreviationDeclaration::getCodeByteSize(this_00);
    (this->AttrValue).Offset = uVar3 + bVar1;
    updateForIndex(this,this_00,0);
  }
  return;
}

Assistant:

DWARFDie::attribute_iterator::attribute_iterator(DWARFDie D, bool End)
    : Die(D), Index(0) {
  auto AbbrDecl = Die.getAbbreviationDeclarationPtr();
  assert(AbbrDecl && "Must have abbreviation declaration");
  if (End) {
    // This is the end iterator so we set the index to the attribute count.
    Index = AbbrDecl->getNumAttributes();
  } else {
    // This is the begin iterator so we extract the value for this->Index.
    AttrValue.Offset = D.getOffset() + AbbrDecl->getCodeByteSize();
    updateForIndex(*AbbrDecl, 0);
  }
}